

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_default_vfs_open(ma_vfs *pVFS,char *pFilePath,ma_uint32 openMode,ma_vfs_file *pFile)

{
  undefined8 *in_RCX;
  int in_EDX;
  long in_RSI;
  ma_vfs_file *in_RDI;
  undefined4 in_stack_00000008;
  ma_uint32 in_stack_fffffffffffffffc;
  ma_result mVar1;
  
  if (in_RCX == (undefined8 *)0x0) {
    mVar1 = MA_INVALID_ARGS;
  }
  else {
    *in_RCX = 0;
    if ((in_RSI == 0) || (in_EDX == 0)) {
      mVar1 = MA_INVALID_ARGS;
    }
    else {
      mVar1 = ma_default_vfs_open__stdio
                        ((ma_vfs *)CONCAT44(openMode,in_stack_00000008),(char *)pFile,
                         in_stack_fffffffffffffffc,in_RDI);
    }
  }
  return mVar1;
}

Assistant:

static ma_result ma_default_vfs_open(ma_vfs* pVFS, const char* pFilePath, ma_uint32 openMode, ma_vfs_file* pFile)
{
    if (pFile == NULL) {
        return MA_INVALID_ARGS;
    }

    *pFile = NULL;

    if (pFilePath == NULL || openMode == 0) {
        return MA_INVALID_ARGS;
    }

#if defined(MA_USE_WIN32_FILEIO)
    return ma_default_vfs_open__win32(pVFS, pFilePath, openMode, pFile);
#else
    return ma_default_vfs_open__stdio(pVFS, pFilePath, openMode, pFile);
#endif
}